

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeConsistentInertiaMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixNM<double,_12,_12> *M)

{
  ulong *puVar1;
  double dVar2;
  double dVar3;
  element_type *peVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double *pdVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  double dVar60;
  ulong uVar61;
  double dVar62;
  double dVar63;
  ulong uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  ulong uVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar75 [16];
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  double dVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  ulong local_e0;
  ulong local_d8;
  
  lVar16 = 0;
  memset(M,0,0x480);
  dVar60 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x58))();
  uVar61 = (**(code **)((long)(((this->sectionA).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 0x60))();
  dVar62 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x178))();
  dVar63 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x180))();
  uVar64 = (**(code **)((long)(((this->sectionA).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 0x188))();
  uVar65 = (**(code **)((long)(((this->sectionA).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 400))();
  uVar66 = (**(code **)((long)(((this->sectionA).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 0x198))();
  uVar67 = (**(code **)((long)(((this->sectionB).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 0x58))();
  dVar68 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x60))();
  dVar69 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x178))();
  dVar70 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x180))();
  dVar71 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x188))();
  dVar72 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 400))();
  dVar73 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x198))();
  dVar2 = this->length;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar2;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = dVar62;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = dVar69;
  peVar4 = (this->avg_sec_par).
           super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = dVar60;
  auVar17 = vmulsd_avx512f(auVar119,ZEXT816(0x4014000000000000));
  auVar53._0_8_ = peVar4->phimy;
  auVar53._8_8_ = peVar4->phimz;
  dVar3 = peVar4->phimz;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar3;
  auVar18 = vmulsd_avx512f(auVar126,auVar119);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar67;
  auVar19 = vmulsd_avx512f(auVar132,auVar119);
  auVar20 = vfmadd213sd_avx512f(ZEXT816(0x3fe0000000000000),auVar129,ZEXT816(0xbfb999999999999a));
  auVar21 = vmulsd_avx512f(auVar119,auVar119);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar62 * 6.0;
  auVar22 = vdivsd_avx512f(auVar30,auVar17);
  auVar23 = vmulsd_avx512f(auVar126,auVar21);
  auVar24 = vmulsd_avx512f(auVar132,auVar21);
  vmovsd_avx512f(auVar19);
  vmovsd_avx512f(auVar18);
  auVar25 = vmulsd_avx512f(auVar129,auVar129);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar69 * 6.0;
  auVar26 = vdivsd_avx512f(auVar31,auVar17);
  auVar52._8_8_ = 0x3ff0000000000000;
  auVar52._0_8_ = 0x3ff0000000000000;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar3 * 0.7;
  auVar27 = vfmadd231sd_avx512f(auVar115,auVar25,ZEXT816(0x3fd5555555555555));
  auVar28 = vaddsd_avx512f(auVar27,ZEXT816(0x3fd7c57c57c57c58));
  auVar98._0_8_ = (double)auVar53._0_8_ + 1.0;
  auVar98._8_8_ = (double)auVar53._8_8_ + 1.0;
  auVar29 = vmulsd_avx512f(auVar18,auVar28);
  auVar27 = vdivpd_avx(auVar52,auVar98);
  auVar12 = vshufpd_avx(auVar27,auVar27,1);
  dVar76 = auVar12._0_8_ * auVar12._0_8_;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = dVar63;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar76;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar76 * auVar29._0_8_;
  auVar22 = vfmadd231sd_fma(auVar45,auVar75,auVar22);
  auVar28 = vmulsd_avx512f(auVar19,auVar28);
  dVar69 = peVar4->mu;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar69;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar76 * auVar28._0_8_;
  auVar26 = vfmadd231sd_fma(auVar51,auVar75,auVar26);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = peVar4->Jyy;
  auVar28 = vmulsd_avx512f(auVar137,ZEXT816(0xc018000000000000));
  auVar28 = vdivsd_avx512f(auVar28,auVar17);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar3 * 0.3;
  auVar29 = vfmadd231sd_avx512f(auVar101,auVar25,ZEXT816(0x3fc5555555555555));
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar28._0_8_ * dVar76;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar2 * dVar69 * (auVar29._0_8_ + 0.12857142857142856);
  auVar28 = vfmadd231sd_fma(auVar33,auVar75,auVar102);
  auVar29 = vmulsd_avx512f(auVar130,auVar20);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar3 * 0.09166666666666666;
  auVar30 = vfmadd231sd_avx512f(auVar36,auVar25,ZEXT816(0x3fa5555555555555));
  dVar74 = auVar30._0_8_ + 0.05238095238095238;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar74;
  auVar30 = vmulsd_avx512f(auVar24,auVar37);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = auVar29._0_8_ * dVar76;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = auVar23._0_8_ * dVar74;
  auVar52 = vfmsub231sd_fma(auVar86,auVar75,auVar103);
  auVar29 = vmulsd_avx512f(auVar122,auVar20);
  auVar31 = vmulsd_avx512f(auVar21,auVar116);
  auVar32 = vmulsd_avx512f(auVar137,auVar20);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar76;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = auVar29._0_8_ * dVar76;
  auVar75 = vfmsub231sd_fma(auVar87,auVar38,auVar30);
  auVar29 = vmulsd_avx512f(auVar119,auVar21);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar67;
  auVar33 = vmulsd_avx512f(auVar133,auVar29);
  dVar74 = dVar69 * auVar29._0_8_;
  dVar60 = dVar60 * auVar29._0_8_;
  auVar30 = vmulsd_avx512f(auVar129,ZEXT816(0x3fc5555555555555));
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar3 * 0.016666666666666666;
  auVar34 = vfmadd231sd_avx512f(auVar104,auVar25,ZEXT816(0x3f81111111111111));
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar3 * 0.075;
  auVar29 = vfmadd231sd_avx512f(auVar40,auVar25,ZEXT816(0x3fa5555555555555));
  auVar41._8_8_ = 0;
  auVar41._0_8_ = auVar31._0_8_ * (auVar29._0_8_ + 0.030952380952380953);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = auVar32._0_8_ * dVar76;
  auVar29 = vfmadd231sd_fma(auVar88,auVar38,auVar41);
  auVar32 = vfmadd213sd_avx512f(ZEXT816(0x3fd5555555555555),auVar25,auVar30);
  auVar25 = vfmadd213sd_avx512f(auVar25,ZEXT816(0xbfc5555555555555),auVar30);
  auVar25 = vaddsd_avx512f(auVar25,ZEXT816(0x3fa1111111111111));
  dVar120 = dVar2 * (auVar32._0_8_ + 0.13333333333333333);
  auVar25 = vmulsd_avx512f(auVar119,auVar25);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar120;
  auVar30 = vmulsd_avx512f(auVar122,auVar42);
  auVar13._8_8_ = extraout_XMM0_Qb_00;
  auVar13._0_8_ = uVar66;
  auVar32 = vaddsd_avx512f(auVar34,ZEXT816(0x3f83813813813814));
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar60;
  auVar35 = vmulsd_avx512f(auVar127,auVar32);
  auVar32 = vmulsd_avx512f(auVar33,auVar32);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar76 * auVar30._0_8_;
  auVar36 = vfmadd231sd_avx512f(auVar43,auVar38,auVar32);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = peVar4->Jyy;
  auVar25 = vmulsd_avx512f(auVar138,auVar25);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar62 * dVar120 * dVar76;
  auVar37 = vfmadd231sd_avx512f(auVar89,auVar38,auVar35);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar74;
  auVar25 = vmulsd_avx512f(auVar38,auVar25);
  dVar76 = (double)auVar53._0_8_ * (double)auVar53._0_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar74 * (auVar34._0_8_ + 0.007142857142857143);
  auVar25 = vfmadd231sd_fma(auVar25,auVar38,auVar105);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar63 * 6.0;
  auVar30 = vdivsd_avx512f(auVar106,auVar17);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar70;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = (double)auVar53._0_8_ * 0.7;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar76;
  auVar77 = ZEXT816(0x3fd5555555555555);
  auVar32 = vfmadd231sd_avx512f(auVar34,auVar90,auVar77);
  auVar32 = vaddsd_avx512f(auVar32,ZEXT816(0x3fd7c57c57c57c58));
  dVar120 = auVar27._0_8_;
  dVar74 = dVar120 * dVar120;
  auVar18 = vmulsd_avx512f(auVar18,auVar32);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar74;
  auVar18 = vmulsd_avx512f(auVar35,auVar18);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar70 * 6.0;
  auVar34 = vdivsd_avx512f(auVar107,auVar17);
  auVar38 = vfmadd231sd_avx512f(auVar18,auVar35,auVar30);
  auVar18 = vmulsd_avx512f(auVar19,auVar32);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar74;
  auVar18 = vmulsd_avx512f(auVar39,auVar18);
  auVar30 = vfmadd231sd_fma(auVar18,auVar39,auVar34);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = peVar4->Jzz;
  auVar18 = vmulsd_avx512f(auVar100,ZEXT816(0xc018000000000000));
  auVar108._8_8_ = 0;
  auVar108._0_8_ = (double)auVar53._0_8_ * 0.3;
  auVar19 = vfmadd231sd_avx512f(auVar108,auVar90,ZEXT816(0x3fc5555555555555));
  auVar18 = vdivsd_avx512f(auVar18,auVar17);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = auVar19._0_8_ + 0.12857142857142856;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar2 * dVar69;
  auVar19 = vmulsd_avx512f(auVar136,auVar109);
  auVar18 = vmulsd_avx512f(auVar18,auVar39);
  auVar32 = vmulsd_avx512f(auVar53,ZEXT816(0x3fb7777777777777));
  auVar39 = vfmadd231sd_avx512f(auVar18,auVar39,auVar19);
  auVar14._8_8_ = extraout_XMM0_Qb;
  auVar14._0_8_ = uVar65;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar76;
  auVar51 = ZEXT816(0x3fa5555555555555);
  auVar18 = vfmadd231sd_avx512f(auVar32,auVar91,auVar51);
  auVar18 = vaddsd_avx512f(auVar18,ZEXT816(0x3faad1ad1ad1ad1b));
  auVar19 = vmulsd_avx512f(auVar13,ZEXT816(0x3fe0000000000000));
  auVar40 = vmulsd_avx512f(auVar14,ZEXT816(0x3fe0000000000000));
  auVar41 = vfmadd213sd_avx512f(ZEXT816(0x3fe0000000000000),auVar53,ZEXT816(0xbfb999999999999a));
  auVar42 = vmulsd_avx512f(auVar19,auVar27);
  auVar19 = vmulsd_avx512f(auVar23,auVar18);
  auVar23 = vmulsd_avx512f(auVar117,auVar41);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar74;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = auVar23._0_8_ * dVar74;
  auVar34 = vfmsub231sd_fma(auVar121,auVar46,auVar19);
  auVar18 = vmulsd_avx512f(auVar24,auVar18);
  auVar19 = vmulsd_avx512f(auVar44,auVar41);
  auVar19 = vmulsd_avx512f(auVar19,auVar46);
  auVar43 = vmulsd_avx512f(auVar53,ZEXT816(0x3fc5555555555555));
  auVar35 = vfmsub231sd_fma(auVar19,auVar46,auVar18);
  auVar19 = vfmadd213sd_avx512f(ZEXT816(0xbfc5555555555555),auVar91,auVar43);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = (double)auVar53._0_8_ * 0.075;
  auVar18 = vfmadd231sd_avx512f(auVar80,auVar91,auVar51);
  auVar23 = vmulsd_avx512f(auVar100,auVar41);
  auVar23 = vmulsd_avx512f(auVar23,auVar46);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = auVar31._0_8_ * (auVar18._0_8_ + 0.030952380952380953);
  auVar44 = vfmadd231sd_avx512f(auVar23,auVar46,auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = (double)auVar53._0_8_ * 0.016666666666666666;
  auVar18 = vfmadd231sd_fma(auVar82,auVar91,ZEXT816(0x3f81111111111111));
  dVar69 = auVar18._0_8_ + 0.009523809523809525;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar76;
  auVar23 = vfmadd213sd_avx512f(auVar77,auVar92,auVar43);
  auVar45 = vmovddup_avx512vl(auVar21);
  auVar23 = vaddsd_avx512f(auVar23,ZEXT816(0x3fc1111111111111));
  dVar76 = dVar2 * auVar23._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar74 * dVar70 * dVar76;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar69 * auVar33._0_8_;
  auVar23 = vfmadd231sd_fma(auVar23,auVar46,auVar123);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = dVar60 * dVar69;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = dVar63 * dVar76 * dVar74;
  auVar24 = vfmadd231sd_fma(auVar131,auVar46,auVar128);
  dVar69 = peVar4->Jyz;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar69;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = auVar18._0_8_ + 0.007142857142857143;
  auVar18 = vmulsd_avx512f(auVar99,auVar49);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar74 * peVar4->Jzz * dVar2 * (auVar19._0_8_ + 0.03333333333333333);
  auVar31 = vfmadd231sd_fma(auVar118,auVar46,auVar18);
  auVar19 = ZEXT816(0x4018000000000000);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar64;
  auVar18 = vmulsd_avx512f(auVar134,auVar19);
  auVar33 = vdivsd_avx512f(auVar18,auVar17);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar71 * 6.0;
  auVar46 = vdivsd_avx512f(auVar47,auVar17);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar69 * -6.0;
  auVar47 = vdivsd_avx512f(auVar48,auVar17);
  auVar48 = vdivsd_avx512f(auVar136,auVar19);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar2 * peVar4->Jxx;
  auVar49 = vdivsd_avx512f(auVar50,auVar19);
  auVar18 = ZEXT816(0x3fb5555555555555);
  auVar19 = vfmadd213sd_fma(auVar77,auVar53,auVar18);
  auVar17 = vfmadd213sd_fma(auVar77,auVar129,auVar18);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar3 * 0.08333333333333333;
  auVar32 = vfmadd231sd_fma(auVar83,auVar53,auVar18);
  auVar18 = vmulsd_avx512f(auVar53,ZEXT816(0x3fd5555555555555));
  auVar18 = vfmadd213sd_fma(auVar18,auVar129,auVar32);
  auVar43 = vfnmadd231sd_avx512f(auVar32,auVar129,auVar43);
  auVar50 = vaddsd_avx512f(auVar18,ZEXT816(0x3fc1111111111111));
  auVar84._8_8_ = 0x3fa5555555555555;
  auVar84._0_8_ = 0x3fa5555555555555;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = local_e0;
  auVar32._8_8_ = 0x3fa1111111111111;
  auVar32._0_8_ = 0x3fa1111111111111;
  auVar18 = vfmadd213pd_avx512vl(auVar84,auVar53,auVar32);
  auVar93._0_8_ = auVar45._0_8_ * auVar18._0_8_;
  auVar93._8_8_ = auVar45._8_8_ * auVar18._8_8_;
  auVar18 = vfmadd213sd_avx512f(auVar51,auVar129,ZEXT816(0x3fa999999999999a));
  auVar32 = vfmadd213sd_avx512f(auVar51,auVar53,ZEXT816(0x3fa999999999999a));
  auVar45 = vmulsd_avx512f(auVar21,auVar18);
  auVar51 = vdivsd_avx512f(auVar110,ZEXT816(0x4008000000000000));
  auVar32 = vmulsd_avx512f(auVar21,auVar32);
  auVar18._0_8_ = peVar4->Qy;
  auVar18._8_8_ = peVar4->Qz;
  uVar67 = 0x13;
  vmovsd_avx512f(auVar51);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array
       [0];
  auVar21 = vmulsd_avx512f(auVar119,auVar17);
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0xc;
  vmovsd_avx512f(auVar42);
  *pdVar15 = *pdVar15;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar40._0_8_;
  auVar17 = vmulsd_avx512f(auVar12,auVar17);
  auVar40 = vmulsd_avx512f(auVar14,auVar21);
  auVar42 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar40 = vmulsd_avx512f(auVar12,auVar40);
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0x18;
  vmovsd_avx512f(auVar17);
  *pdVar15 = *pdVar15;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x24]
       = 0.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x30]
       = auVar40._0_8_;
  auVar40 = vxorpd_avx512vl(auVar119,auVar42);
  auVar51 = vmulsd_avx512f(auVar19,auVar40);
  auVar17 = vmulsd_avx512f(auVar13,auVar51);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3c]
       = dVar120 * auVar17._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x48]
       = auVar48._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6c]
       = 0.0;
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0xd;
  vmovsd_avx512f(auVar38);
  *pdVar15 = *pdVar15;
  auVar38 = vmulsd_avx512f(auVar27,auVar12);
  auVar17 = vmulsd_avx512f(auVar33,auVar38);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x19]
       = auVar17._0_8_;
  auVar17 = vmulsd_avx512f(auVar134,auVar20);
  auVar17 = vmulsd_avx512f(auVar17,auVar38);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x31]
       = auVar17._0_8_;
  auVar17 = vmulsd_avx512f(auVar124,auVar20);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3d]
       = auVar34._0_8_;
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0x55;
  vmovsd_avx512f(auVar39);
  *pdVar15 = *pdVar15;
  auVar17 = vmulsd_avx512f(auVar17,auVar38);
  auVar19 = vmulsd_avx512f(auVar47,auVar38);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x61]
       = auVar19._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x79]
       = auVar17._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = auVar22._0_8_;
  auVar22 = vxorpd_avx512vl(auVar42,auVar52);
  auVar52 = vxorpd_avx512vl(auVar17,auVar42);
  dVar3 = (double)vmovlpd_avx(auVar22);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = dVar3;
  auVar17 = vxorpd_avx512vl(auVar41,auVar42);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar64;
  auVar17 = vmulsd_avx512f(auVar135,auVar17);
  auVar17 = vmulsd_avx512f(auVar17,auVar38);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3e]
       = auVar17._0_8_;
  auVar17 = vshufpd_avx512vl(auVar18,auVar18,1);
  auVar22._8_8_ = 0x3fe0000000000000;
  auVar22._0_8_ = 0x3fe0000000000000;
  auVar17 = vmulpd_avx512vl(auVar17,auVar22);
  auVar111._0_8_ = dVar120 * auVar17._0_8_;
  dVar60 = auVar27._8_8_;
  auVar111._8_8_ = dVar60 * auVar17._8_8_;
  auVar17 = vxorpd_avx512vl(auVar111,auVar42);
  dVar3 = (double)vmovlpd_avx(auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x54]
       = dVar3;
  auVar17 = vshufpd_avx(auVar111,auVar111,1);
  auVar17 = vxorpd_avx512vl(auVar17,auVar42);
  dVar3 = (double)vmovlpd_avx(auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x60]
       = dVar3;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x49) = auVar111;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x56]
       = auVar19._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = auVar28._0_8_;
  auVar77._8_8_ = 0x3fc3333333333333;
  auVar77._0_8_ = 0x3fc3333333333333;
  auVar17 = vmulsd_avx512f(auVar124,auVar41);
  auVar125._8_8_ = 0x3fc5555555555555;
  auVar125._0_8_ = 0x3fc5555555555555;
  auVar22 = vmulsd_avx512f(auVar17,auVar38);
  auVar19 = vunpcklpd_avx512vl(auVar40,auVar119);
  auVar17 = vunpcklpd_avx512vl(auVar44,auVar22);
  auVar34 = vxorpd_avx512vl(auVar17,auVar42);
  auVar17 = vfmadd231pd_fma(auVar77,auVar53,auVar125);
  auVar28._8_8_ = 0xbfb5555555555555;
  auVar28._0_8_ = 0xbfb5555555555555;
  auVar28 = vfmadd213pd_avx512vl(auVar125,auVar53,auVar28);
  dVar74 = auVar19._0_8_;
  auVar78._0_8_ = auVar17._0_8_ * dVar74;
  dVar76 = auVar19._8_8_;
  auVar78._8_8_ = auVar17._8_8_ * dVar76;
  auVar17 = vmulpd_avx512vl(auVar18,auVar78);
  auVar79._0_8_ = dVar120 * auVar17._0_8_;
  auVar79._8_8_ = dVar60 * auVar17._8_8_;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x6d) = auVar79;
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0x7a;
  vmovsd_avx512f(auVar29);
  *pdVar15 = *pdVar15;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x85) = auVar34;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar61;
  auVar19 = vmulsd_avx512f(auVar119,auVar19);
  auVar17 = vunpcklpd_avx(auVar79,auVar52);
  auVar19 = vdivsd_avx512f(auVar19,ZEXT816(0x4008000000000000));
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0x27;
  vmovsd_avx512f(auVar19);
  *pdVar15 = *pdVar15;
  auVar19 = vxorpd_avx512vl(auVar45,auVar42);
  auVar19 = vmulsd_avx512f(auVar13,auVar19);
  auVar19 = vmulsd_avx512f(auVar12,auVar19);
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0x33;
  vmovsd_avx512f(auVar19);
  *pdVar15 = *pdVar15;
  auVar19 = vxorpd_avx512vl(auVar32,auVar42);
  auVar19 = vmulsd_avx512f(auVar14,auVar19);
  auVar19 = vmulsd_avx512f(auVar27,auVar19);
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0x3f;
  vmovsd_avx512f(auVar19);
  *pdVar15 = *pdVar15;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4b]
       = 0.0;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x57) = auVar17;
  auVar17 = vxorpd_avx512vl(auVar29,auVar42);
  auVar17 = vshufpd_avx(auVar79,auVar17,1);
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   99) = auVar17;
  auVar17 = vmulpd_avx512vl(auVar18,auVar93);
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0x6f;
  vmovsd_avx512f(auVar49);
  *pdVar15 = *pdVar15;
  auVar94._0_8_ = dVar120 * auVar17._0_8_;
  auVar94._8_8_ = dVar60 * auVar17._8_8_;
  auVar17 = vxorpd_avx512vl(auVar42,auVar25);
  auVar17 = vshufpd_avx(auVar94,auVar17,1);
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x7b) = auVar17;
  dVar3 = (double)vmovlpd_avx(auVar94);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x87]
       = dVar3;
  auVar17 = vshufpd_avx(auVar94,auVar94,1);
  auVar19 = vxorpd_avx512vl(auVar17,auVar42);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = auVar37._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar50._0_8_;
  auVar27 = vmulsd_avx512f(auVar40,auVar27);
  auVar17 = vmulsd_avx512f(auVar135,auVar27);
  auVar17 = vmulsd_avx512f(auVar38,auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x40]
       = auVar17._0_8_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar69 * dVar2 * (auVar43._0_8_ + 0.03333333333333333);
  auVar25 = vmulsd_avx512f(auVar38,auVar112);
  auVar113._0_8_ = auVar28._0_8_ * dVar74;
  auVar113._8_8_ = auVar28._8_8_ * dVar76;
  auVar29._8_8_ = extraout_XMM0_Qb_02;
  auVar29._0_8_ = dVar73;
  auVar17 = vshufpd_avx(auVar113,auVar113,1);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x88]
       = auVar25._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x41]
       = auVar24._0_8_;
  auVar18 = vmulpd_avx512vl(auVar18,auVar17);
  auVar18 = vmulpd_avx512vl(auVar12,auVar18);
  dVar3 = (double)vmovlpd_avx(auVar18);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x78]
       = dVar3;
  dVar3 = (double)vmovhpd_avx(auVar18);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x84]
       = dVar3;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x4c) = auVar18;
  pdVar15 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
            array + 0x59;
  vmovsd_avx512f(auVar44);
  *pdVar15 = *pdVar15;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x65]
       = auVar22._0_8_;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x70) = auVar19;
  auVar18 = vxorpd_avx512vl(auVar31,auVar42);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7d]
       = auVar25._0_8_;
  auVar25._8_8_ = extraout_XMM0_Qb_01;
  auVar25._0_8_ = dVar72;
  dVar3 = (double)vmovlpd_avx(auVar18);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = dVar3;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = local_d8;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar73 * auVar45._0_8_;
  auVar17 = vmulsd_avx512f(auVar12,auVar85);
  auVar18 = vdivsd_avx512f(auVar95,ZEXT816(0x4008000000000000));
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = auVar18._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar72 * -0.5;
  auVar18 = vmulsd_avx512f(auVar96,auVar12);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5a]
       = dVar120 * dVar73 * -0.5;
  auVar19 = vmulsd_avx512f(auVar25,auVar21);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x66]
       = auVar18._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x72]
       = 0.0;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar71;
  auVar18 = vmulsd_avx512f(auVar12,auVar19);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7e]
       = auVar18._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8a]
       = dVar120 * dVar73 * auVar51._0_8_;
  auVar18 = vunpcklpd_avx(auVar25,auVar29);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = auVar30._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar46._0_8_;
  auVar19 = vmulsd_avx512f(auVar38,auVar12);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x67]
       = auVar19._0_8_;
  auVar19 = vxorpd_avx512vl(auVar20,auVar42);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar71 * auVar19._0_8_;
  auVar19 = vmulsd_avx512f(auVar21,auVar38);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7f]
       = auVar19._0_8_;
  auVar19 = vxorpd_avx512vl(auVar42,auVar35);
  dVar3 = (double)vmovlpd_avx(auVar19);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = dVar3;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = auVar26._0_8_;
  auVar97._8_8_ = 0x3fd5555555555555;
  auVar97._0_8_ = 0x3fd5555555555555;
  auVar26._8_8_ = 0x3fd6666666666666;
  auVar26._0_8_ = 0x3fd6666666666666;
  auVar53 = vfmadd213pd_avx512vl(auVar97,auVar53,auVar26);
  dVar74 = auVar53._0_8_ * dVar74;
  dVar76 = auVar53._8_8_ * dVar76;
  auVar53 = vunpcklpd_avx512vl(auVar14,auVar13);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x25]
       = dVar120 * auVar53._0_8_ * dVar74;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x26]
       = dVar60 * auVar53._8_8_ * dVar76;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x73]
       = dVar120 * auVar18._0_8_ * dVar74;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x74]
       = dVar60 * auVar18._8_8_ * dVar76;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = auVar75._0_8_;
  auVar53 = vmulsd_avx512f(auVar114,auVar41);
  auVar53 = vmulsd_avx512f(auVar53,auVar38);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8c]
       = auVar53._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2 * dVar68;
  auVar53 = vdivsd_avx512f(auVar24,ZEXT816(0x4008000000000000));
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = auVar53._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x81]
       = auVar17._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8d]
       = dVar120 * dVar72 * auVar32._0_8_;
  auVar54 = vpbroadcastq_avx512f(ZEXT816(8));
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = auVar36._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar71 * auVar27._0_8_;
  auVar53 = vmulsd_avx512f(auVar38,auVar20);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8e]
       = auVar53._0_8_;
  auVar55 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = auVar23._0_8_;
  auVar56 = vpbroadcastq_avx512f(ZEXT816(0x60));
  pdVar15 = (double *)M;
  do {
    auVar57 = vpbroadcastq_avx512f();
    auVar57 = vpaddq_avx512f(auVar57,auVar55);
    auVar58 = vpbroadcastq_avx512f();
    uVar61 = 0;
    do {
      auVar59 = vpbroadcastq_avx512f();
      vpmullq_avx512dq(auVar57,auVar56);
      auVar57 = vpaddq_avx512f(auVar57,auVar54);
      auVar59 = vporq_avx512f(auVar59,auVar55);
      uVar64 = vpcmpuq_avx512f(auVar59,auVar58,2);
      auVar59 = vgatherqpd_avx512f(*(undefined8 *)
                                    ((long)(M->
                                           super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>
                                           ).m_storage.m_data.array + uVar61 + lVar16 * 8));
      puVar1 = (ulong *)(pdVar15 + uVar61);
      bVar5 = (bool)((byte)uVar64 & 1);
      bVar6 = (bool)((byte)(uVar64 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar64 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar64 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar64 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar64 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar64 >> 6) & 1);
      *puVar1 = (ulong)bVar5 * (ulong)((byte)uVar64 & 1) * auVar59._0_8_ | (ulong)!bVar5 * *puVar1;
      puVar1[1] = (ulong)bVar6 * (ulong)((byte)(uVar64 >> 1) & 1) * auVar59._8_8_ |
                  (ulong)!bVar6 * puVar1[1];
      puVar1[2] = (ulong)bVar7 * (ulong)((byte)(uVar64 >> 2) & 1) * auVar59._16_8_ |
                  (ulong)!bVar7 * puVar1[2];
      puVar1[3] = (ulong)bVar8 * (ulong)((byte)(uVar64 >> 3) & 1) * auVar59._24_8_ |
                  (ulong)!bVar8 * puVar1[3];
      puVar1[4] = (ulong)bVar9 * (ulong)((byte)(uVar64 >> 4) & 1) * auVar59._32_8_ |
                  (ulong)!bVar9 * puVar1[4];
      puVar1[5] = (ulong)bVar10 * (ulong)((byte)(uVar64 >> 5) & 1) * auVar59._40_8_ |
                  (ulong)!bVar10 * puVar1[5];
      puVar1[6] = (ulong)bVar11 * (ulong)((byte)(uVar64 >> 6) & 1) * auVar59._48_8_ |
                  (ulong)!bVar11 * puVar1[6];
      puVar1[7] = (uVar64 >> 7) * (uVar64 >> 7) * auVar59._56_8_ |
                  (ulong)!SUB81(uVar64 >> 7,0) * puVar1[7];
      uVar61 = uVar61 + 8;
    } while ((uVar67 & 0xfffffffffffffff8) != uVar61);
    lVar16 = lVar16 + 1;
    pdVar15 = pdVar15 + 0xd;
    uVar67 = uVar67 - 1;
  } while (lVar16 != 0xc);
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeConsistentInertiaMatrix(ChMatrixNM<double, 12, 12>& M) {
    M.setZero();

    double mu1 = this->sectionA->GetMassPerUnitLength();
    double Jxx1 = this->sectionA->GetInertiaJxxPerUnitLength();
    double Jyy1 = this->sectionA->GetInertiaJyyPerUnitLength();
    double Jzz1 = this->sectionA->GetInertiaJzzPerUnitLength();
    double Jyz1 = this->sectionA->GetInertiaJyzPerUnitLength();
    double Qy1 = this->sectionA->GetInertiaQyPerUnitLength();
    double Qz1 = this->sectionA->GetInertiaQzPerUnitLength();

    double mu2 = this->sectionB->GetMassPerUnitLength();
    double Jxx2 = this->sectionB->GetInertiaJxxPerUnitLength();
    double Jyy2 = this->sectionB->GetInertiaJyyPerUnitLength();
    double Jzz2 = this->sectionB->GetInertiaJzzPerUnitLength();
    double Jyz2 = this->sectionB->GetInertiaJyzPerUnitLength();
    double Qy2 = this->sectionB->GetInertiaQyPerUnitLength();
    double Qz2 = this->sectionB->GetInertiaQzPerUnitLength();

    double L = this->GetLength();
    double LL = L * L;
    double LLL = LL * L;
    double mu = this->avg_sec_par->mu;
    double Jyy = this->avg_sec_par->Jyy;
    double Jzz = this->avg_sec_par->Jzz;
    double Jyz = this->avg_sec_par->Jyz;
    double Jxx = this->avg_sec_par->Jxx;
    double Qy = this->avg_sec_par->Qy;
    double Qz = this->avg_sec_par->Qz;
    double phiy = this->avg_sec_par->phimy;
    double phiz = this->avg_sec_par->phimz;

    double phiy2 = phiy * phiy;
    double phiz2 = phiz * phiz;
    double oneplusphiy = 1.0 / (phiy + 1.);
    double oneplusphiz = 1.0 / (phiz + 1.);
    double oneplusphiy2 = oneplusphiy * oneplusphiy;
    double oneplusphiz2 = oneplusphiz * oneplusphiz;
    double oneplusphiyz = oneplusphiy * oneplusphiz;

    double rAy1 =
        6. * Jyy1 / (5. * L) * oneplusphiz2 + mu1 * L * (1. / 3. * phiz2 + 7. / 10. * phiz + 13. / 35.) * oneplusphiz2;
    double rAz1 =
        6. * Jzz1 / (5. * L) * oneplusphiy2 + mu1 * L * (1. / 3. * phiy2 + 7. / 10. * phiy + 13. / 35.) * oneplusphiy2;
    double rAy2 =
        6. * Jyy2 / (5. * L) * oneplusphiz2 + mu2 * L * (1. / 3. * phiz2 + 7. / 10. * phiz + 13. / 35.) * oneplusphiz2;
    double rAz2 =
        6. * Jzz2 / (5. * L) * oneplusphiy2 + mu2 * L * (1. / 3. * phiy2 + 7. / 10. * phiy + 13. / 35.) * oneplusphiy2;
    // double rAy =
    // 6. * Jyy / (5. * L) * oneplusphiz2 + mu * L * (1. / 3. * phiz2 + 7. / 10. * phiz + 13. / 35.) * oneplusphiz2;
    // double rAz =
    // 6. * Jzz / (5. * L) * oneplusphiy2 + mu * L * (1. / 3. * phiy2 + 7. / 10. * phiy + 13. / 35.) * oneplusphiy2;

    double rBy =
        (mu * L * (1. / 6. * phiz2 + 3. / 10. * phiz + 9. / 70.)) * oneplusphiz2 - 6. * Jyy / (5. * L) * oneplusphiz2;
    double rBz =
        (mu * L * (1. / 6. * phiy2 + 3. / 10. * phiy + 9. / 70.)) * oneplusphiy2 - 6. * Jzz / (5. * L) * oneplusphiy2;

    double rCy1 = (mu1 * LL * (1. / 24. * phiz2 + 11. / 120. * phiz + 11. / 210.)) * oneplusphiz2 -
                  (1. / 2. * phiz - 1. / 10.) * Jyy1 * oneplusphiz2;
    double rCz1 = (mu1 * LL * (1. / 24. * phiy2 + 11. / 120. * phiy + 11. / 210.)) * oneplusphiy2 -
                  (1. / 2. * phiy - 1. / 10.) * Jzz1 * oneplusphiy2;
    double rCy2 = (mu2 * LL * (1. / 24. * phiz2 + 11. / 120. * phiz + 11. / 210.)) * oneplusphiz2 -
                  (1. / 2. * phiz - 1. / 10.) * Jyy2 * oneplusphiz2;
    double rCz2 = (mu2 * LL * (1. / 24. * phiy2 + 11. / 120. * phiy + 11. / 210.)) * oneplusphiy2 -
                  (1. / 2. * phiy - 1. / 10.) * Jzz2 * oneplusphiy2;
    // double rCy = (mu * LL * (1. / 24. * phiz2 + 11. / 120. * phiz + 11. / 210.)) * oneplusphiz2 -
    //(1. / 2. * phiz - 1. / 10.) * Jyy * oneplusphiz2;
    // double rCz = (mu * LL * (1. / 24. * phiy2 + 11. / 120. * phiy + 11. / 210.)) * oneplusphiy2 -
    //(1. / 2. * phiy - 1. / 10.) * Jzz * oneplusphiy2;

    double rDy = (mu * LL * (1. / 24. * phiz2 + 3. / 40. * phiz + 13. / 420.)) * oneplusphiz2 +
                 (1. / 2. * phiz - 1. / 10.) * Jyy * oneplusphiz2;
    double rDz = (mu * LL * (1. / 24. * phiy2 + 3. / 40. * phiy + 13. / 420.)) * oneplusphiy2 +
                 (1. / 2. * phiy - 1. / 10.) * Jzz * oneplusphiy2;

    double rEy1 = mu1 * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 105.) * oneplusphiz2 +
                  L * (1. / 3. * phiz2 + 1. / 6. * phiz + 2. / 15.) * Jyy1 * oneplusphiz2;
    double rEz1 = mu1 * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 105.) * oneplusphiy2 +
                  L * (1. / 3. * phiy2 + 1. / 6. * phiy + 2. / 15.) * Jzz1 * oneplusphiy2;
    double rEy2 = mu2 * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 105.) * oneplusphiz2 +
                  L * (1. / 3. * phiz2 + 1. / 6. * phiz + 2. / 15.) * Jyy2 * oneplusphiz2;
    double rEz2 = mu2 * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 105.) * oneplusphiy2 +
                  L * (1. / 3. * phiy2 + 1. / 6. * phiy + 2. / 15.) * Jzz2 * oneplusphiy2;
    // double rEy = mu * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 105.) * oneplusphiz2 +
    // L * (1. / 3. * phiz2 + 1. / 6. * phiz + 2. / 15.) * Jyy * oneplusphiz2;
    // double rEz = mu * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 105.) * oneplusphiy2 +
    // L * (1. / 3. * phiy2 + 1. / 6. * phiy + 2. / 15.) * Jzz * oneplusphiy2;

    double rFy = (mu * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 140.)) * oneplusphiz2 +
                 L * (-1. / 6. * phiz2 + 1. / 6. * phiz + 1. / 30.) * Jyy * oneplusphiz2;
    double rFz = (mu * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 140.)) * oneplusphiy2 +
                 L * (-1. / 6. * phiy2 + 1. / 6. * phiy + 1. / 30.) * Jzz * oneplusphiy2;

    double rGy1 = Qy1 / 2. * oneplusphiz;
    double rGz1 = Qz1 / 2. * oneplusphiy;
    double rGy2 = Qy2 / 2. * oneplusphiz;
    double rGz2 = Qz2 / 2. * oneplusphiy;
    double rGy = Qy / 2. * oneplusphiz;
    double rGz = Qz / 2. * oneplusphiy;

    double rHy1 = L * (1. / 3. * phiy + 1. / 12.) * Qz1 * oneplusphiy;
    double rHz1 = L * (1. / 3. * phiz + 1. / 12.) * Qy1 * oneplusphiz;
    double rHy2 = L * (1. / 3. * phiy + 1. / 12.) * Qz2 * oneplusphiy;
    double rHz2 = L * (1. / 3. * phiz + 1. / 12.) * Qy2 * oneplusphiz;
    // double rHy = L * (1. / 3. * phiy + 1. / 12.) * Qz * oneplusphiy;
    // double rHz = L * (1. / 3. * phiz + 1. / 12.) * Qy * oneplusphiz;

    double rIy = L * (1. / 6. * phiy - 1. / 12.) * Qz * oneplusphiy;
    double rIz = L * (1. / 6. * phiz - 1. / 12.) * Qy * oneplusphiz;

    double rJyz1 = 6. * Jyz1 / (5. * L) * oneplusphiyz;
    double rJyz2 = 6. * Jyz2 / (5. * L) * oneplusphiyz;
    double rJyz = 6. * Jyz / (5. * L) * oneplusphiyz;

    double rKy = L * (1. / 6. * phiy + 3. / 20.) * Qy * oneplusphiy;
    double rKz = L * (1. / 6. * phiz + 3. / 20.) * Qz * oneplusphiz;

    double rLy1 = L * (1. / 3. * phiy + 7. / 20.) * Qy1 * oneplusphiy;
    double rLz1 = L * (1. / 3. * phiz + 7. / 20.) * Qz1 * oneplusphiz;
    double rLy2 = L * (1. / 3. * phiy + 7. / 20.) * Qy2 * oneplusphiy;
    double rLz2 = L * (1. / 3. * phiz + 7. / 20.) * Qz2 * oneplusphiz;
    // double rLy = L * (1. / 3. * phiy + 7. / 20.) * Qy * oneplusphiy;
    // double rLz = L * (1. / 3. * phiz + 7. / 20.) * Qz * oneplusphiz;

    double rMy1 = (1. / 2. * phiy - 1. / 10.) * Jyz1 * oneplusphiyz;
    double rMz1 = (1. / 2. * phiz - 1. / 10.) * Jyz1 * oneplusphiyz;
    double rMy2 = (1. / 2. * phiy - 1. / 10.) * Jyz2 * oneplusphiyz;
    double rMz2 = (1. / 2. * phiz - 1. / 10.) * Jyz2 * oneplusphiyz;
    double rMy = (1. / 2. * phiy - 1. / 10.) * Jyz * oneplusphiyz;
    double rMz = (1. / 2. * phiz - 1. / 10.) * Jyz * oneplusphiyz;

    double rNyz1 = L * (1. / 12. * phiy + 1. / 12. * phiz + 1. / 3. * phiy * phiz + 2. / 15.) * Jyz1 * oneplusphiyz;
    double rNyz2 = L * (1. / 12. * phiy + 1. / 12. * phiz + 1. / 3. * phiy * phiz + 2. / 15.) * Jyz2 * oneplusphiyz;
    // double rNyz = L * (1. / 12. * phiy + 1. / 12. * phiz + 1. / 3. * phiy * phiz + 2. / 15.) * Jyz * oneplusphiyz;

    double rOyz = L * (1. / 12. * phiy + 1. / 12. * phiz - 1. / 6. * phiy * phiz + 1. / 30.) * Jyz * oneplusphiyz;
    double rPy = LL * (1. / 24. * phiy + 1. / 30.) * Qy * oneplusphiy;
    double rPz = LL * (1. / 24. * phiz + 1. / 30.) * Qz * oneplusphiz;

    double rQy1 = LL * (1. / 24. * phiy + 1. / 20.) * Qy1 * oneplusphiy;
    double rQz1 = LL * (1. / 24. * phiz + 1. / 20.) * Qz1 * oneplusphiz;
    double rQy2 = LL * (1. / 24. * phiy + 1. / 20.) * Qy2 * oneplusphiy;
    double rQz2 = LL * (1. / 24. * phiz + 1. / 20.) * Qz2 * oneplusphiz;
    // double rQy = LL * (1. / 24. * phiy + 1. / 20.) * Qy * oneplusphiy;
    // double rQz = LL * (1. / 24. * phiz + 1. / 20.) * Qz * oneplusphiz;

    M(0, 0) = mu1 * L / 3.;
    M(1, 0) = rGz1;
    M(2, 0) = rGy1;
    M(3, 0) = 0.;
    M(4, 0) = rHz1;
    M(5, 0) = -rHy1;

    M(6, 0) = mu * L / 6.;
    M(7, 0) = -rGz;
    M(8, 0) = -rGy;
    M(9, 0) = 0.;
    M(10, 0) = rIz;
    M(11, 0) = -rIy;

    M(1, 1) = rAz1;
    M(2, 1) = rJyz1;
    M(3, 1) = -rLy1;
    M(4, 1) = rMz1;
    M(5, 1) = rCz1;

    M(6, 1) = rGz;
    M(7, 1) = rBz;
    M(8, 1) = -rJyz;
    M(9, 1) = -rKy;
    M(10, 1) = rMz;
    M(11, 1) = -rDz;

    M(2, 2) = rAy1;
    M(3, 2) = rLz1;
    M(4, 2) = -rCy1;
    M(5, 2) = -rMy1;

    M(6, 2) = rGy;
    M(7, 2) = -rJyz;
    M(8, 2) = rBy;
    M(9, 2) = rKz;
    M(10, 2) = rDy;
    M(11, 2) = -rMy;

    M(3, 3) = L * Jxx1 / 3.;
    M(4, 3) = -rQz1;
    M(5, 3) = -rQy1;

    M(6, 3) = 0.;
    M(7, 3) = -rKy;
    M(8, 3) = rKz;
    M(9, 3) = L * Jxx / 6.;
    M(10, 3) = rPz;
    M(11, 3) = rPy;

    M(4, 4) = rEy1;
    M(5, 4) = -rNyz1;

    M(6, 4) = rIz;
    M(7, 4) = -rMz;
    M(8, 4) = -rDy;
    M(9, 4) = -rPz;
    M(10, 4) = -rFy;
    M(11, 4) = rOyz;

    M(5, 5) = rEz1;

    M(6, 5) = -rIy;
    M(7, 5) = rDz;
    M(8, 5) = rMy;
    M(9, 5) = -rPy;
    M(10, 5) = rOyz;
    M(11, 5) = -rFz;

    M(6, 6) = mu2 * L / 3.;
    M(7, 6) = -rGz2;
    M(8, 6) = -rGy2;
    M(9, 6) = 0.;
    M(10, 6) = rHz2;
    M(11, 6) = -rHy2;
    M(7, 7) = rAz2;
    M(8, 7) = rJyz2;
    M(9, 7) = -rLy2;
    M(10, 7) = -rMz2;
    M(11, 7) = -rCz2;
    M(8, 8) = rAy2;
    M(9, 8) = rLz2;
    M(10, 8) = rCy2;
    M(11, 8) = rMy2;
    M(9, 9) = L * Jxx2 / 3.;
    M(10, 9) = rQz2;
    M(11, 9) = rQy2;
    M(10, 10) = rEy2;
    M(11, 10) = -rNyz2;
    M(11, 11) = rEz2;

    // obtain the symmetric right-top elements by mirror
    for (int i = 0; i < 12; i++) {
        for (int j = i; j < 12; j++) {
            M(i, j) = M(j, i);
        }
    }
}